

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

SigHashType * __thiscall cfd::core::SigHashType::ToString_abi_cxx11_(SigHashType *this)

{
  long in_RSI;
  allocator local_45 [13];
  string local_38 [8];
  string result;
  SigHashType *this_local;
  
  ::std::__cxx11::string::string(local_38);
  if (*(int *)(in_RSI + 4) == 1) {
    ::std::__cxx11::string::operator=(local_38,"ALL");
  }
  else if (*(int *)(in_RSI + 4) == 2) {
    ::std::__cxx11::string::operator=(local_38,"NONE");
  }
  else {
    if (*(int *)(in_RSI + 4) != 3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",local_45);
      ::std::allocator<char>::~allocator((allocator<char> *)local_45);
      goto LAB_0050abfa;
    }
    ::std::__cxx11::string::operator=(local_38,"SINGLE");
  }
  if ((*(byte *)(in_RSI + 8) & 1) != 0) {
    ::std::__cxx11::string::operator+=(local_38,"|ANYONECANPAY");
  }
  if ((*(byte *)(in_RSI + 9) & 1) != 0) {
    ::std::__cxx11::string::operator+=(local_38,"|RANGEPROOF");
  }
  ::std::__cxx11::string::string((string *)this,local_38);
LAB_0050abfa:
  ::std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string SigHashType::ToString() const {
  std::string result;
  if (hash_algorithm_ == kSigHashAll) {
    result = "ALL";
  } else if (hash_algorithm_ == kSigHashNone) {
    result = "NONE";
  } else if (hash_algorithm_ == kSigHashSingle) {
    result = "SINGLE";
  } else {
    return "";
  }
  if (is_anyone_can_pay_) result += "|ANYONECANPAY";
  if (is_fork_id_) result += "|RANGEPROOF";
  return result;
}